

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O3

bool __thiscall
DIS::IncomingMessage::AddProcessor(IncomingMessage *this,uchar id,IPacketProcessor *pp)

{
  bool bVar1;
  value_type candidate;
  pair<const_unsigned_char,_DIS::IPacketProcessor_*> local_28;
  iterator local_18;
  
  local_28.first = id;
  local_28.second = pp;
  bVar1 = FindProccessorContainer(this,id,pp,&local_18);
  if (!bVar1) {
    std::
    _Rb_tree<unsigned_char,std::pair<unsigned_char_const,DIS::IPacketProcessor*>,std::_Select1st<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
    ::_M_emplace_equal<std::pair<unsigned_char_const,DIS::IPacketProcessor*>&>
              ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,DIS::IPacketProcessor*>,std::_Select1st<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
                *)&this->_processors,&local_28);
  }
  return !bVar1;
}

Assistant:

bool IncomingMessage::AddProcessor(unsigned char id, IPacketProcessor* pp)
{
   PacketProcessorContainer::value_type candidate(id,pp);
   PacketProcessorContainer::iterator containerIter;

   // If this id doesn't already have this processor (it shouldn't)
   if (!FindProccessorContainer(id, pp, containerIter))
   {
       _processors.insert( candidate );
       return true;
   }

   return false;    
}